

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **args)

{
  vector<ErrorInfoException,_std::allocator<ErrorInfoException>_> *pvVar1;
  vector<Token,_std::allocator<Token>_> *v;
  set<Symbol,_std::less<Symbol>,_std::allocator<Symbol>_> *v_00;
  char *pcVar2;
  pair<std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
  lines;
  string filename;
  lexical lexical;
  Table table;
  vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_> local_250;
  pair<std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
  local_238;
  string local_208 [32];
  undefined1 local_1e8 [288];
  Table local_c8;
  
  if (argc < 2) {
    pcVar2 = "code.java";
  }
  else {
    pcVar2 = args[1];
  }
  std::__cxx11::string::string(local_208,pcVar2,(allocator *)local_1e8);
  readCode((string *)local_1e8);
  StringLine::convert_string(&local_238,(string *)local_1e8._0_8_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1e8 + 8));
  local_c8.keyWords._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8.keyWords._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c8.keyWords._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8.keyWords._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8.keyWords._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8.operators._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8.operators._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c8.operators._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8.operators._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8.operators._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8.delimiters._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8.delimiters._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c8.delimiters._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8.delimiters._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8.delimiters._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8.escape_chars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8.escape_chars._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c8.escape_chars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8.escape_chars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8.escape_chars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8.keyWords._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8.keyWords._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c8.operators._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8.operators._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c8.delimiters._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8.delimiters._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c8.escape_chars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8.escape_chars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Table::load_all(&local_c8);
  ::lexical::lexical((lexical *)local_1e8,&local_c8);
  std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>::vector
            (&local_250,&local_238.first);
  ::lexical::analyse((lexical *)local_1e8,&local_250);
  std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>::~vector
            (&local_250);
  pvVar1 = ::lexical::get_errors((lexical *)local_1e8);
  print_code(&local_238.first,pvVar1);
  pvVar1 = ::lexical::get_errors((lexical *)local_1e8);
  print_errors(pvVar1);
  v = ::lexical::get_tokens((lexical *)local_1e8);
  print_token(v);
  v_00 = ::lexical::get_symbols((lexical *)local_1e8);
  print_symbols(v_00);
  ::lexical::~lexical((lexical *)local_1e8);
  Table::~Table(&local_c8);
  std::
  pair<std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
  ::~pair(&local_238);
  std::__cxx11::string::~string(local_208);
  return 0;
}

Assistant:

int main(int argc, char **args) {
    string filename = argc < 2 ? "code.java" : args[1];

    /**
     * 去除注释
     */
    auto lines = StringLine::convert_string(readCode(filename).get());
    /**
     * 加载 关键字、运算符、分隔符表
     */
    Table table;
    table.load_all();
    /**
     * 调用词法分析器
     */
    lexical lexical(table);
    lexical.analyse(lines.first);


    print_code(lines.first, lexical.get_errors());
    print_errors(lexical.get_errors());
    print_token(lexical.get_tokens());
    print_symbols(lexical.get_symbols());
}